

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

int orient_3d_filter(double *p0,double *p1,double *p2,double *p3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_b8;
  double upper_bound_1;
  double lower_bound_1;
  double max3;
  double max2;
  double max1;
  double eps;
  int int_tmp_result;
  double Delta;
  double a33;
  double a32;
  double a31;
  double a23;
  double a22;
  double a21;
  double a13;
  double a12;
  double a11;
  double *p3_local;
  double *p2_local;
  double *p1_local;
  double *p0_local;
  
  dVar1 = p1[1] - p0[1];
  dVar2 = p1[2] - p0[2];
  dVar3 = *p2 - *p0;
  dVar4 = p2[1] - p0[1];
  dVar5 = p2[2] - p0[2];
  dVar6 = *p3 - *p0;
  dVar7 = p3[1] - p0[1];
  dVar8 = p3[2] - p0[2];
  dVar9 = dVar6 * (dVar1 * dVar5 + -(dVar2 * dVar4)) +
          (*p1 - *p0) * (dVar4 * dVar8 + -(dVar5 * dVar7)) +
          -(dVar3 * (dVar1 * dVar8 + -(dVar2 * dVar7)));
  max2 = ABS(*p1 - *p0);
  if (max2 < ABS(dVar3)) {
    max2 = ABS(dVar3);
  }
  if (max2 < ABS(dVar6)) {
    max2 = ABS(dVar6);
  }
  max3 = ABS(dVar1);
  if (max3 < ABS(dVar2)) {
    max3 = ABS(dVar2);
  }
  if (max3 < ABS(dVar4)) {
    max3 = ABS(dVar4);
  }
  if (max3 < ABS(dVar5)) {
    max3 = ABS(dVar5);
  }
  lower_bound_1 = ABS(dVar4);
  if (lower_bound_1 < ABS(dVar5)) {
    lower_bound_1 = ABS(dVar5);
  }
  if (lower_bound_1 < ABS(dVar7)) {
    lower_bound_1 = ABS(dVar7);
  }
  if (lower_bound_1 < ABS(dVar8)) {
    lower_bound_1 = ABS(dVar8);
  }
  upper_bound_1 = max2;
  local_b8 = max2;
  if (max2 <= max3) {
    if (max2 < max3) {
      local_b8 = max3;
    }
  }
  else {
    upper_bound_1 = max3;
  }
  if (upper_bound_1 <= lower_bound_1) {
    if (local_b8 < lower_bound_1) {
      local_b8 = lower_bound_1;
    }
  }
  else {
    upper_bound_1 = lower_bound_1;
  }
  if (1.632880184967483e-98 <= upper_bound_1) {
    if (local_b8 <= 5.599361855444509e+101) {
      dVar1 = max3 * lower_bound_1 * max2 * 5.11071278299733e-15;
      if (dVar9 <= dVar1) {
        if (-dVar1 <= dVar9) {
          return 0;
        }
        eps._4_4_ = -1;
      }
      else {
        eps._4_4_ = 1;
      }
      p0_local._4_4_ = eps._4_4_;
    }
    else {
      p0_local._4_4_ = 0;
    }
  }
  else {
    p0_local._4_4_ = 0;
  }
  return p0_local._4_4_;
}

Assistant:

inline int orient_3d_filter(const double* p0, const double* p1, const double* p2, const double* p3) {
    double a11;
    a11 = (p1[0] - p0[0]);
    double a12;
    a12 = (p1[1] - p0[1]);
    double a13;
    a13 = (p1[2] - p0[2]);
    double a21;
    a21 = (p2[0] - p0[0]);
    double a22;
    a22 = (p2[1] - p0[1]);
    double a23;
    a23 = (p2[2] - p0[2]);
    double a31;
    a31 = (p3[0] - p0[0]);
    double a32;
    a32 = (p3[1] - p0[1]);
    double a33;
    a33 = (p3[2] - p0[2]);
    double Delta;
    Delta = (((a11 * ((a22 * a33) - (a23 * a32))) - (a21 * ((a12 * a33) - (a13 * a32)))) + (a31 * ((a12 * a23) - (a13 * a22))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(a11);
    if((max1 < fabs(a21)))
    {
        max1 = fabs(a21);
    }
    if((max1 < fabs(a31)))
    {
        max1 = fabs(a31);
    }
    double max2 = fabs(a12);
    if((max2 < fabs(a13)))
    {
        max2 = fabs(a13);
    }
    if((max2 < fabs(a22)))
    {
        max2 = fabs(a22);
    }
    if((max2 < fabs(a23)))
    {
        max2 = fabs(a23);
    }
    double max3 = fabs(a22);
    if((max3 < fabs(a23)))
    {
        max3 = fabs(a23);
    }
    if((max3 < fabs(a32)))
    {
        max3 = fabs(a32);
    }
    if((max3 < fabs(a33)))
    {
        max3 = fabs(a33);
    }
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if((max2 < lower_bound_1))
    {
        lower_bound_1 = max2;
    }
    else
    {
        if((max2 > upper_bound_1))
        {
            upper_bound_1 = max2;
        }
    }
    if((max3 < lower_bound_1))
    {
        lower_bound_1 = max3;
    }
    else
    {
        if((max3 > upper_bound_1))
        {
            upper_bound_1 = max3;
        }
    }
    if((lower_bound_1 < 1.63288018496748314939e-98))
    {
        return FPG_UNCERTAIN_VALUE;
    }
    else
    {
        if((upper_bound_1 > 5.59936185544450928309e+101))
        {
            return FPG_UNCERTAIN_VALUE;
        }
        eps = (5.11071278299732992696e-15 * ((max2 * max3) * max1));
        if((Delta > eps))
        {
            int_tmp_result = 1;
        }
        else
        {
            if((Delta < -eps))
            {
                int_tmp_result = -1;
            }
            else
            {
                return FPG_UNCERTAIN_VALUE;
            }
        }
    }
    return int_tmp_result;
}